

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

bool compareFile(string *a,string *b)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  bool bVar5;
  undefined1 auStack_20030 [8];
  array<unsigned_char,_65536UL> temp0;
  array<unsigned_char,_65536UL> temp1;
  
  __stream = fopen((a->_M_dataplus)._M_p,"rb");
  __stream_00 = fopen((b->_M_dataplus)._M_p,"rb");
  do {
    sVar2 = fread(auStack_20030,1,0x10000,__stream);
    sVar3 = fread(temp0._M_elems + 0xfff8,1,0x10000,__stream_00);
    iVar4 = (int)sVar2;
    if (iVar4 != (int)sVar3) {
LAB_00167354:
      bVar5 = false;
      goto LAB_00167357;
    }
    iVar1 = bcmp(auStack_20030,temp0._M_elems + 0xfff8,(long)iVar4);
    if (iVar1 != 0) goto LAB_00167354;
  } while (0 < iVar4);
  bVar5 = true;
LAB_00167357:
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return bVar5;
}

Assistant:

bool compareFile(const std::string& a, const std::string& b)
{
    std::array<uint8_t, 65536> temp0;
    std::array<uint8_t, 65536> temp1;
    File fp0 = File{a};
    File fp1 = File{b};
    while (true) {
        int rc0 = fp0.Read(temp0);
        int rc1 = fp1.Read(temp1);
        if (rc0 != rc1)
            return false;
        if (memcmp(&temp0[0], &temp1[0], rc0) != 0)
            return false;
        if (rc0 <= 0)
            break;
    }
    return true;
}